

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

void freeArchivers(void)

{
  int iVar1;
  
  do {
    if (numArchivers == 0) {
      (*__PHYSFS_AllocatorHooks.Free)(archivers);
      (*__PHYSFS_AllocatorHooks.Free)(archiveInfo);
      archivers = (PHYSFS_Archiver **)0x0;
      archiveInfo = (PHYSFS_ArchiveInfo **)0x0;
      return;
    }
    iVar1 = doDeregisterArchiver(numArchivers - 1);
  } while (iVar1 != 0);
  __assert_fail("!\"nothing should be mounted during shutdown.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs.c"
                ,0x544,"void freeArchivers(void)");
}

Assistant:

static void freeArchivers(void)
{
    while (numArchivers > 0)
    {
        if (!doDeregisterArchiver(numArchivers - 1))
            assert(!"nothing should be mounted during shutdown.");
    } /* while */

    allocator.Free(archivers);
    allocator.Free(archiveInfo);
    archivers = NULL;
    archiveInfo = NULL;
}